

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericBlendersTests.cpp
# Opt level: O1

void __thiscall
agge::tests::GenericRGBXBlenderTests::BlendingWhiteOnBlackProducesGrayDependingOnCover
          (GenericRGBXBlenderTests *this)

{
  color cVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  pixel dest [7];
  pixel reference [7];
  long local_98;
  uint8_t uStack_90;
  uint8_t uStack_8f;
  uint8_t uStack_8e;
  uint8_t uStack_8d;
  uint8_t uStack_8c;
  uint8_t uStack_8b;
  uint8_t uStack_8a;
  uint8_t uStack_89;
  uint8_t local_88;
  uint8_t local_87;
  uint8_t local_86;
  uint8_t uStack_85;
  undefined8 local_84;
  string local_78;
  pixel_rgbx<agge::order_rgba> local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined8 uStack_4c;
  undefined8 uStack_44;
  LocationInfo local_38;
  
  cVar1 = color::make(0xff,0xff,0xff,0xff);
  uStack_8d = '\0';
  uStack_89 = '\0';
  uStack_85 = '\0';
  iVar3 = ((uint)cVar1 >> 0x18) * 0x40 + (((uint)cVar1 >> 0x18) * 0x1f9) / 1000;
  uVar5 = (uint)cVar1 & 0xff;
  uVar2 = (uint)cVar1 >> 8 & 0xff;
  uVar4 = (uint)cVar1 >> 0x10 & 0xff;
  iVar6 = iVar3 * 0x12;
  local_98 = (ulong)CONCAT12((char)(uVar4 * iVar6 >> 0x16),
                             CONCAT11((char)(uVar2 * iVar6 >> 0x16),(char)(uVar5 * iVar6 >> 0x16)))
             << 0x20;
  iVar6 = iVar3 * 0x21;
  uStack_90 = (uint8_t)(uVar5 * iVar6 >> 0x16);
  uStack_8f = (uint8_t)(uVar2 * iVar6 >> 0x16);
  uStack_8e = (uint8_t)(uVar4 * iVar6 >> 0x16);
  iVar6 = iVar3 * 0x71;
  uStack_8c = (uint8_t)(uVar5 * iVar6 >> 0x16);
  uStack_8b = (uint8_t)(uVar2 * iVar6 >> 0x16);
  uStack_8a = (uint8_t)(uVar4 * iVar6 >> 0x16);
  iVar6 = iVar3 * 0x81;
  local_88 = (uint8_t)(uVar5 * iVar6 >> 0x16);
  local_87 = (uint8_t)(uVar2 * iVar6 >> 0x16);
  local_86 = (uint8_t)(uVar4 * iVar6 >> 0x16);
  iVar6 = iVar3 * 0xf0;
  local_84._1_1_ = (uint8_t)(uVar2 * iVar6 >> 0x16);
  local_84._0_1_ = (uint8_t)(uVar5 * iVar6 >> 0x16);
  local_84._2_1_ = (char)(uVar4 * iVar6 >> 0x16);
  local_84._3_1_ = '\0';
  if (iVar3 == 0x4040) {
    local_84._0_5_ = CONCAT14(cVar1.r,local_84._0_4_);
    local_84._0_6_ = CONCAT15(cVar1.g,(undefined5)local_84);
    local_84._0_7_ = CONCAT16(cVar1.b,(undefined6)local_84);
  }
  else {
    iVar3 = iVar3 * 0xff;
    local_84._0_5_ = CONCAT14((uint8_t)(uVar5 * iVar3 >> 0x16),local_84._0_4_);
    local_84._0_6_ = CONCAT15((uint8_t)(uVar2 * iVar3 >> 0x16),(undefined5)local_84);
    local_84._0_7_ = CONCAT16((char)(uVar4 * iVar3 >> 0x16),(undefined6)local_84);
  }
  local_84 = (ulong)(uint7)local_84;
  uStack_44 = 0xffffffffefefefef;
  local_58.components[0] = '\0';
  local_58.components[1] = '\0';
  local_58.components[2] = '\0';
  local_58.components[3] = '\0';
  uStack_54 = 0x11111111;
  uStack_50 = 0x20202020;
  uStack_4c = 0x8080808070707070;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/GenericBlendersTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_38,&local_78,0x3e);
  ut::
  are_equal<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,agge::tests::mocks::pixel_rgbx<agge::order_rgba>,7ul>
            ((pixel_rgbx<agge::order_rgba> (*) [7])&local_58,
             (pixel_rgbx<agge::order_rgba> (*) [7])&local_98,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.filename._M_dataplus._M_p != &local_38.filename.field_2) {
    operator_delete(local_38.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  return;
}

Assistant:

test( BlendingWhiteOnBlackProducesGrayDependingOnCover )
			{
				typedef mocks::pixel_rgbx<order_rgba> pixel;

				// INIT
				const int n = 7;
				const pixel black = { };
				const uint8_t covers[n] = { 0x00, 0x12, 0x21, 0x71, 0x81, 0xF0, 0xFF };
				blender_solid_color_rgb<pixel, order_rgba> whiteness(color::make(0xFF, 0xFF, 0xFF));
				pixel dest[n];

				fill_n(dest, n, black);

				// ACT
				whiteness(dest + 0, 0, 0, 1, covers + 0);
				whiteness(dest + 1, 0, 0, 1, covers + 1);
				whiteness(dest + 2, 0, 0, 1, covers + 2);
				whiteness(dest + 3, 0, 0, 1, covers + 3);
				whiteness(dest + 4, 0, 0, 1, covers + 4);
				whiteness(dest + 5, 0, 0, 1, covers + 5);
				whiteness(dest + 6, 0, 0, 1, covers + 6);

				// ASSERT
				pixel reference[] = {
					{ { 0x00, 0x00, 0x00, 0x00 } },
					{ { 0x11, 0x11, 0x11, 0x11 } },
					{ { 0x20, 0x20, 0x20, 0x20 } },
					{ { 0x70, 0x70, 0x70, 0x70 } },
					{ { 0x80, 0x80, 0x80, 0x80 } },
					{ { 0xEF, 0xEF, 0xEF, 0xEF } },
					{ { 0xFF, 0xFF, 0xFF, 0xFF } },
				};

				assert_equal(reference, dest);
			}